

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O2

void __thiscall Analysis::FlowAnalysis_RHIC(Analysis *this)

{
  shared_ptr<RandomUtil::Random> *psVar1;
  shared_ptr<particleSamples> *psVar2;
  pointer ppsVar3;
  ostream *poVar4;
  bool bVar5;
  singleParticleSpectra *psVar6;
  singleParticleSpectra **ipart;
  pointer ppsVar7;
  ulong uVar8;
  double dVar9;
  ParameterReader paraRdr;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  singleParticleSpectra *local_ec0;
  ParameterReader local_eb8;
  _Vector_base<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> local_e88;
  ostream *local_e68;
  int local_e5c;
  ulong local_e58;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_e50;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_e40;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_e30;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_e20;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_e10;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_e00;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_df0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_de0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_dd0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_dc0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_db0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_da0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_d90;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_d80;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_d70;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_d60;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_d50;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_d40;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_d30;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_d20;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_d10;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_d00;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_cf0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_ce0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_cd0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_cc0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_cb0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_ca0;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_c90;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_c80;
  __shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2> local_c70;
  __shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2> local_c60;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ParameterReader::ParameterReader(&local_eb8,&this->paraRdr_);
  std::__cxx11::string::string((string *)&local_d0,"compute_correlation",(allocator *)&local_e88);
  dVar9 = ParameterReader::getVal(&local_eb8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if ((int)dVar9 == 1) {
    std::__cxx11::string::string((string *)&local_f0,"compute_correlation",(allocator *)&local_e88);
    ParameterReader::setVal(&local_eb8,&local_f0,0.0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::__cxx11::string::string
            ((string *)&local_110,"flag_charge_dependence",(allocator *)&local_e88);
  dVar9 = ParameterReader::getVal(&local_eb8,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if ((int)dVar9 == 1) {
    std::__cxx11::string::string
              ((string *)&local_130,"flag_charge_dependence",(allocator *)&local_e88);
    ParameterReader::setVal(&local_eb8,&local_130,0.0);
    std::__cxx11::string::~string((string *)&local_130);
  }
  local_e88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_150,"particle_monval",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_150,99999.0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_170,"rap_type",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_170,0.0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_190,"rapidity_distribution",(allocator *)&local_ec0)
  ;
  ParameterReader::setVal(&local_eb8,&local_190,1.0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string
            ((string *)&local_1b0,"vn_rapidity_dis_pT_min",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_1b0,0.0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string
            ((string *)&local_1d0,"vn_rapidity_dis_pT_max",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_1d0,4.0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string
            ((string *)&local_1f0,"rapidityPTDistributionFlag",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_1f0,1.0);
  std::__cxx11::string::~string((string *)&local_1f0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_210,(string *)this);
  psVar1 = &this->ran_gen_ptr_;
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c70,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_210,(shared_ptr<RandomUtil::Random> *)&local_c70);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c70._M_refcount);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"particle_monval",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_230,9999.0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"rap_type",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_250,0.0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_270,"rapidity_distribution",(allocator *)&local_ec0)
  ;
  ParameterReader::setVal(&local_eb8,&local_270,1.0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string
            ((string *)&local_290,"vn_rapidity_dis_pT_min",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_290,0.2);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string
            ((string *)&local_2b0,"vn_rapidity_dis_pT_max",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_2b0,3.0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string
            ((string *)&local_2d0,"rapidityPTDistributionFlag",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_2d0,1.0);
  std::__cxx11::string::~string((string *)&local_2d0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_2f0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c80,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_2f0,(shared_ptr<RandomUtil::Random> *)&local_c80);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c80._M_refcount);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string
            ((string *)&local_310,"rapidityPTDistributionFlag",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_310,0.0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string((string *)&local_330,"rap_min",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_330,-0.5);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::string((string *)&local_350,"rap_max",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_350,0.5);
  std::__cxx11::string::~string((string *)&local_350);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_370,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c90,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_370,(shared_ptr<RandomUtil::Random> *)&local_c90);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c90._M_refcount);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string((string *)&local_390,"rap_min",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_390,-1.0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::string((string *)&local_3b0,"rap_max",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_3b0,-0.5);
  std::__cxx11::string::~string((string *)&local_3b0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_3d0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_ca0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_3d0,(shared_ptr<RandomUtil::Random> *)&local_ca0);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ca0._M_refcount);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string((string *)&local_3f0,"rap_min",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_3f0,0.5);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string((string *)&local_410,"rap_max",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_410,1.0);
  std::__cxx11::string::~string((string *)&local_410);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_430,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_cb0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_430,(shared_ptr<RandomUtil::Random> *)&local_cb0);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_cb0._M_refcount);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::string((string *)&local_450,"rap_min",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_450,-3.9);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::string((string *)&local_470,"rap_max",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_470,-3.1);
  std::__cxx11::string::~string((string *)&local_470);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_490,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_cc0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_490,(shared_ptr<RandomUtil::Random> *)&local_cc0);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_cc0._M_refcount);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::string((string *)&local_4b0,"rap_min",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_4b0,3.1);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::string((string *)&local_4d0,"rap_max",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_4d0,3.9);
  std::__cxx11::string::~string((string *)&local_4d0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_4f0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_cd0,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_4f0,(shared_ptr<RandomUtil::Random> *)&local_cd0);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_cd0._M_refcount);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::string
            ((string *)&local_510,"vn_rapidity_dis_pT_min",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_510,0.2);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::string
            ((string *)&local_530,"vn_rapidity_dis_pT_max",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_530,3.0);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::string
            ((string *)&local_550,"pidwithRapidityPTDistribution",(allocator *)&local_ec0);
  local_e68 = (ostream *)ParameterReader::getVal(&local_eb8,&local_550,0.0);
  std::__cxx11::string::~string((string *)&local_550);
  if (((double)local_e68 == 1.0) && (!NAN((double)local_e68))) {
    std::__cxx11::string::string
              ((string *)&local_570,"rapidityPTDistributionFlag",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_570,1.0);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::string((string *)&local_590,"rap_type",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_590,1.0);
    std::__cxx11::string::~string((string *)&local_590);
    std::__cxx11::string::string((string *)&local_5b0,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_5b0,211.0);
    std::__cxx11::string::~string((string *)&local_5b0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_5d0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_ce0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_5d0,(shared_ptr<RandomUtil::Random> *)&local_ce0);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ce0._M_refcount);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::__cxx11::string::string((string *)&local_5f0,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_5f0,-211.0);
    std::__cxx11::string::~string((string *)&local_5f0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_610,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_cf0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_610,(shared_ptr<RandomUtil::Random> *)&local_cf0);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_cf0._M_refcount);
    std::__cxx11::string::~string((string *)&local_610);
    std::__cxx11::string::string((string *)&local_630,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_630,321.0);
    std::__cxx11::string::~string((string *)&local_630);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_650,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d00,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_650,(shared_ptr<RandomUtil::Random> *)&local_d00);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d00._M_refcount);
    std::__cxx11::string::~string((string *)&local_650);
    std::__cxx11::string::string((string *)&local_670,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_670,-321.0);
    std::__cxx11::string::~string((string *)&local_670);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_690,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d10,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_690,(shared_ptr<RandomUtil::Random> *)&local_d10);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d10._M_refcount);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::string((string *)&local_6b0,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_6b0,2212.0);
    std::__cxx11::string::~string((string *)&local_6b0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_6d0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d20,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_6d0,(shared_ptr<RandomUtil::Random> *)&local_d20);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d20._M_refcount);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::string((string *)&local_6f0,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_6f0,-2212.0);
    std::__cxx11::string::~string((string *)&local_6f0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_710,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d30,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_710,(shared_ptr<RandomUtil::Random> *)&local_d30);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d30._M_refcount);
    std::__cxx11::string::~string((string *)&local_710);
  }
  std::__cxx11::string::string((string *)&local_730,"rap_type",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_730,1.0);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::string((string *)&local_750,"rapidity_distribution",(allocator *)&local_ec0)
  ;
  ParameterReader::setVal(&local_eb8,&local_750,1.0);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::string((string *)&local_770,"rap_min",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_770,-0.5);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::string((string *)&local_790,"rap_max",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_790,0.5);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::string((string *)&local_7b0,"particle_monval",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_7b0,211.0);
  std::__cxx11::string::~string((string *)&local_7b0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_7d0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d40,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_7d0,(shared_ptr<RandomUtil::Random> *)&local_d40);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d40._M_refcount);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::string((string *)&local_7f0,"particle_monval",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_7f0,-211.0);
  std::__cxx11::string::~string((string *)&local_7f0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_810,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d50,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_810,(shared_ptr<RandomUtil::Random> *)&local_d50);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d50._M_refcount);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::string((string *)&local_830,"particle_monval",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_830,321.0);
  std::__cxx11::string::~string((string *)&local_830);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_850,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d60,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_850,(shared_ptr<RandomUtil::Random> *)&local_d60);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d60._M_refcount);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::string((string *)&local_870,"particle_monval",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_870,-321.0);
  std::__cxx11::string::~string((string *)&local_870);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_890,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d70,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_890,(shared_ptr<RandomUtil::Random> *)&local_d70);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d70._M_refcount);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::string((string *)&local_8b0,"particle_monval",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_8b0,2212.0);
  std::__cxx11::string::~string((string *)&local_8b0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_8d0,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d80,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_8d0,(shared_ptr<RandomUtil::Random> *)&local_d80);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d80._M_refcount);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::string((string *)&local_8f0,"particle_monval",(allocator *)&local_ec0);
  ParameterReader::setVal(&local_eb8,&local_8f0,-2212.0);
  std::__cxx11::string::~string((string *)&local_8f0);
  psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
  std::__cxx11::string::string((string *)&local_910,(string *)this);
  std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d90,&psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)
  ;
  singleParticleSpectra::singleParticleSpectra
            (psVar6,&local_eb8,&local_910,(shared_ptr<RandomUtil::Random> *)&local_d90);
  local_ec0 = psVar6;
  std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
  emplace_back<singleParticleSpectra*>
            ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
             &local_ec0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d90._M_refcount);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::string
            ((string *)&local_930,"resonance_weak_feed_down_flag",(allocator *)&local_ec0);
  local_e68 = (ostream *)ParameterReader::getVal(&local_eb8,&local_930);
  std::__cxx11::string::~string((string *)&local_930);
  if (((double)local_e68 == 0.0) && (!NAN((double)local_e68))) {
    std::__cxx11::string::string((string *)&local_950,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_950,3122.0);
    std::__cxx11::string::~string((string *)&local_950);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_970,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_da0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_970,(shared_ptr<RandomUtil::Random> *)&local_da0);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_da0._M_refcount);
    std::__cxx11::string::~string((string *)&local_970);
    std::__cxx11::string::string((string *)&local_990,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_990,-3122.0);
    std::__cxx11::string::~string((string *)&local_990);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_9b0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_db0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_9b0,(shared_ptr<RandomUtil::Random> *)&local_db0);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_db0._M_refcount);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::__cxx11::string::string((string *)&local_9d0,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_9d0,3312.0);
    std::__cxx11::string::~string((string *)&local_9d0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_9f0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_dc0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_9f0,(shared_ptr<RandomUtil::Random> *)&local_dc0);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_dc0._M_refcount);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::__cxx11::string::string((string *)&local_a10,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_a10,-3312.0);
    std::__cxx11::string::~string((string *)&local_a10);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_a30,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_dd0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_a30,(shared_ptr<RandomUtil::Random> *)&local_dd0);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_dd0._M_refcount);
    std::__cxx11::string::~string((string *)&local_a30);
    std::__cxx11::string::string((string *)&local_a50,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_a50,3334.0);
    std::__cxx11::string::~string((string *)&local_a50);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_a70,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_de0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_a70,(shared_ptr<RandomUtil::Random> *)&local_de0);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_de0._M_refcount);
    std::__cxx11::string::~string((string *)&local_a70);
    std::__cxx11::string::string((string *)&local_a90,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_a90,-3334.0);
    std::__cxx11::string::~string((string *)&local_a90);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_ab0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_df0,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_ab0,(shared_ptr<RandomUtil::Random> *)&local_df0);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_df0._M_refcount);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::__cxx11::string::string((string *)&local_ad0,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_ad0,333.0);
    std::__cxx11::string::~string((string *)&local_ad0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_af0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e00,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_af0,(shared_ptr<RandomUtil::Random> *)&local_e00);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e00._M_refcount);
    std::__cxx11::string::~string((string *)&local_af0);
  }
  std::__cxx11::string::string
            ((string *)&local_b10,"collect_neutral_particles",(allocator *)&local_ec0);
  local_e68 = (ostream *)ParameterReader::getVal(&local_eb8,&local_b10,0.0);
  std::__cxx11::string::~string((string *)&local_b10);
  if (((double)local_e68 == 1.0) && (!NAN((double)local_e68))) {
    std::__cxx11::string::string((string *)&local_b30,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_b30,111.0);
    std::__cxx11::string::~string((string *)&local_b30);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_b50,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e10,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_b50,(shared_ptr<RandomUtil::Random> *)&local_e10);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e10._M_refcount);
    std::__cxx11::string::~string((string *)&local_b50);
    std::__cxx11::string::string((string *)&local_b70,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_b70,311.0);
    std::__cxx11::string::~string((string *)&local_b70);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_b90,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e20,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_b90,(shared_ptr<RandomUtil::Random> *)&local_e20);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e20._M_refcount);
    std::__cxx11::string::~string((string *)&local_b90);
    std::__cxx11::string::string((string *)&local_bb0,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_bb0,-311.0);
    std::__cxx11::string::~string((string *)&local_bb0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_bd0,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e30,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_bd0,(shared_ptr<RandomUtil::Random> *)&local_e30);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e30._M_refcount);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::__cxx11::string::string((string *)&local_bf0,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_bf0,2112.0);
    std::__cxx11::string::~string((string *)&local_bf0);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_c10,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e40,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_c10,(shared_ptr<RandomUtil::Random> *)&local_e40);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e40._M_refcount);
    std::__cxx11::string::~string((string *)&local_c10);
    std::__cxx11::string::string((string *)&local_c30,"particle_monval",(allocator *)&local_ec0);
    ParameterReader::setVal(&local_eb8,&local_c30,-2112.0);
    std::__cxx11::string::~string((string *)&local_c30);
    psVar6 = (singleParticleSpectra *)operator_new(0x8b8);
    std::__cxx11::string::string((string *)&local_c50,(string *)this);
    std::__shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e50,
               &psVar1->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>);
    singleParticleSpectra::singleParticleSpectra
              (psVar6,&local_eb8,&local_c50,(shared_ptr<RandomUtil::Random> *)&local_e50);
    local_ec0 = psVar6;
    std::vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>>::
    emplace_back<singleParticleSpectra*>
              ((vector<singleParticleSpectra*,std::allocator<singleParticleSpectra*>> *)&local_e88,
               &local_ec0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e50._M_refcount);
    std::__cxx11::string::~string((string *)&local_c50);
  }
  psVar2 = &this->particle_list_;
  local_e68 = (ostream *)&this->messager;
  uVar8 = 0;
  while (bVar5 = particleSamples::end_of_file
                           ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr), ppsVar3 = local_e88._M_impl.super__Vector_impl_data._M_finish
        , ppsVar7 = local_e88._M_impl.super__Vector_impl_data._M_start, !bVar5) {
    std::operator<<(local_e68,"Reading event: ");
    poVar4 = local_e68;
    std::ostream::operator<<(local_e68,(int)uVar8 + 1);
    std::operator<<(poVar4," ... ");
    std::__cxx11::string::string((string *)&local_50,"info",(allocator *)&local_ec0);
    pretty_ostream::flush((pretty_ostream *)local_e68,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_e5c = particleSamples::read_in_particle_samples
                          ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr);
    std::operator<<(local_e68,"nev = ");
    std::ostream::operator<<(local_e68,local_e5c);
    std::__cxx11::string::string((string *)&local_70,"info",(allocator *)&local_ec0);
    pretty_ostream::flush((pretty_ostream *)local_e68,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_90," processing ...",(allocator *)&local_ec0);
    local_e58 = uVar8;
    pretty_ostream::info((pretty_ostream *)local_e68,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    ppsVar3 = local_e88._M_impl.super__Vector_impl_data._M_finish;
    for (ppsVar7 = local_e88._M_impl.super__Vector_impl_data._M_start; ppsVar7 != ppsVar3;
        ppsVar7 = ppsVar7 + 1) {
      particleSamples::filter_particles_from_events
                ((psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 (*ppsVar7)->particle_monval);
      psVar6 = *ppsVar7;
      std::__shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_c60,&psVar2->super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>
                );
      singleParticleSpectra::calculate_Qn_vector_shell
                (psVar6,(shared_ptr<particleSamples> *)&local_c60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c60._M_refcount);
    }
    std::__cxx11::string::string((string *)&local_b0,"done!",(allocator *)&local_ec0);
    pretty_ostream::info((pretty_ostream *)local_e68,&local_b0);
    uVar8 = local_e58;
    std::__cxx11::string::~string((string *)&local_b0);
    uVar8 = (ulong)(uint)(local_e5c + (int)uVar8);
  }
  for (; ppsVar7 != ppsVar3; ppsVar7 = ppsVar7 + 1) {
    singleParticleSpectra::output_spectra_and_Qn_results(*ppsVar7);
  }
  if (local_e88._M_impl.super__Vector_impl_data._M_finish !=
      local_e88._M_impl.super__Vector_impl_data._M_start) {
    local_e88._M_impl.super__Vector_impl_data._M_finish =
         local_e88._M_impl.super__Vector_impl_data._M_start;
  }
  std::_Vector_base<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::
  ~_Vector_base(&local_e88);
  ParameterReader::~ParameterReader(&local_eb8);
  return;
}

Assistant:

void Analysis::FlowAnalysis_RHIC() {
    ParameterReader paraRdr = paraRdr_;
    int compute_correlation = paraRdr.getVal("compute_correlation");
    if (compute_correlation == 1) paraRdr.setVal("compute_correlation", 0);
    int flag_charge_dependence = paraRdr.getVal("flag_charge_dependence");
    if (flag_charge_dependence == 1)
        paraRdr.setVal("flag_charge_dependence", 0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;

    // all hadrons (99999) first (collect E_T)
    paraRdr.setVal("particle_monval", 99999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // charged hadron first
    paraRdr.setVal("particle_monval", 9999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // speical triggers follows
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // STAR rapidity cut
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // PHENIX BBC
    paraRdr.setVal("rap_min", -3.9);
    paraRdr.setVal("rap_max", -3.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 3.1);
    paraRdr.setVal("rap_max", 3.9);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // now identified particle
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    if (paraRdr.getVal("pidwithRapidityPTDistribution", 0) == 1) {
        paraRdr.setVal("rapidityPTDistributionFlag", 1);
        paraRdr.setVal("rap_type", 1);
        paraRdr.setVal("particle_monval", 211);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -211);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 321);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -321);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 2212);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -2212);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("particle_monval", 211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    if (paraRdr.getVal("resonance_weak_feed_down_flag") == 0) {
        paraRdr.setVal("particle_monval", 3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 333);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    if (paraRdr.getVal("collect_neutral_particles", 0) == 1) {
        paraRdr.setVal("particle_monval", 111);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}